

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profile.cpp
# Opt level: O2

void __thiscall
Profile::applyProfiling
          (Profile *this,vector<void_*,_std::allocator<void_*>_> *btVec,string *label,
          ShadowValue *sv)

{
  unordered_map<unsigned_long,_std::shared_ptr<DynFuncCall>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
  *this_01;
  bool bVar1;
  uintptr_t uVar2;
  iterator iVar3;
  ostream *poVar4;
  __shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  iterator iVar6;
  iterator iVar7;
  Profile *pPVar8;
  shared_ptr<DynFuncCall> dfc;
  uintptr_t dynHashKey;
  string staticHashKey;
  statHashKey_t shk;
  __shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2> local_d8;
  uintptr_t local_c8;
  key_type local_c0;
  undefined1 local_a0 [40];
  undefined1 local_78 [48];
  
  pPVar8 = (Profile *)&stack0xffffffffffffffb8;
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)&stack0xffffffffffffffb8,btVec);
  uVar2 = __dynHashKey(pPVar8,(vector<void_*,_std::allocator<void_*>_> *)&stack0xffffffffffffffb8);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            ((_Vector_base<void_*,_std::allocator<void_*>_> *)&stack0xffffffffffffffb8);
  local_d8._M_ptr = (DynFuncCall *)0x0;
  local_d8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->__backtraceDynamicMap;
  local_c8 = uVar2;
  iVar3 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,&local_c8);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    pPVar8 = (Profile *)btVec;
    std::vector<void_*,_std::allocator<void_*>_>::vector
              ((vector<void_*,_std::allocator<void_*>_> *)(local_a0 + 0x10),btVec);
    __staticHashKey((statHashKey_t *)local_78,pPVar8,
                    (vector<void_*,_std::allocator<void_*>_> *)(local_a0 + 0x10));
    std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
              ((_Vector_base<void_*,_std::allocator<void_*>_> *)(local_a0 + 0x10));
    std::__cxx11::string::string((string *)&local_c0,(string *)(local_78 + 8));
    this_01 = &this->__backtraceStaticMap;
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
            ::find(&this_01->_M_t,&local_c0);
    if ((_Rb_tree_header *)iVar6._M_node ==
        &(this->__backtraceStaticMap)._M_t._M_impl.super__Rb_tree_header) {
      std::make_shared<DynFuncCall,std::vector<void*,std::allocator<void*>>&,unsigned_long&>
                ((vector<void_*,_std::allocator<void_*>_> *)local_a0,(unsigned_long *)btVec);
      std::__shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_d8,(__shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2> *)local_a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
      p_Var5 = &std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_00,&local_c8)->
                super___shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var5,&local_d8);
      DynFuncCall::updateBtSymbols(local_d8._M_ptr,(statHashKey_t *)local_78);
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
              ::find(&this_01->_M_t,&local_c0);
      if (iVar6._M_node != iVar7._M_node) {
        __assert_fail("__backtraceStaticMap.end() == __backtraceStaticMap.find(staticHashKey)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/internal/src/Profile.cpp"
                      ,0xf4,"void Profile::applyProfiling(vector<void *> &, string, ShadowValue &)")
        ;
      }
      p_Var5 = &std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
                ::operator[](this_01,&local_c0)->
                super___shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var5,&local_d8);
      this->__totalCallStacks = this->__totalCallStacks + 1;
      if (DebugFlag == true) {
        bVar1 = isCurrentDebugType("total");
        if (bVar1) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"applyProfiling");
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xf7);
          poVar4 = std::operator<<(poVar4," Total Call Stack ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
      }
    }
    else {
      p_Var5 = &std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
                ::operator[](this_01,&local_c0)->
                super___shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_d8,p_Var5);
      if (local_d8._M_ptr == (DynFuncCall *)0x0) {
        __assert_fail("dfc",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/internal/src/Profile.cpp"
                      ,0xee,"void Profile::applyProfiling(vector<void *> &, string, ShadowValue &)")
        ;
      }
      p_Var5 = &std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_00,&local_c8)->
                super___shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var5,&local_d8);
    }
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)(local_78 + 8));
  }
  else {
    if (DebugFlag == true) {
      bVar1 = isCurrentDebugType("total");
      if (bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"applyProfiling");
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xfb);
        poVar4 = std::operator<<(poVar4," Elt already in Dynamic Hash Map ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    p_Var5 = &std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_c8)->
              super___shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_d8,p_Var5);
  }
  DynFuncCall::applyProfiling(local_d8._M_ptr,sv);
  this->__totalDynCount = this->__totalDynCount + 1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
  return;
}

Assistant:

void Profile::applyProfiling(vector<void*> & btVec, string label, ShadowValue &sv){
#ifndef USE_LABEL
    //TODO: more efficient to change hashMap with key string?
    uintptr_t dynHashKey = __dynHashKey(btVec);
    UNUSED(label);
#else
    uintptr_t dynHashKey = hashLabel(label);
#endif
    shared_ptr<DynFuncCall> dfc(nullptr);
    auto dynHashKeyIte = __backtraceDynamicMap.find(dynHashKey);
    /* Can not find the element in Dynamic Hash Map */
    if(dynHashKeyIte == __backtraceDynamicMap.end()) {
        /* Update Static HashMap */
#ifndef USE_LABEL
        struct statHashKey_t shk = __staticHashKey(btVec);
        string staticHashKey = shk.hashKey;
#else
        string staticHashKey = label;
#endif
        auto statHashKeyIte = __backtraceStaticMap.find(staticHashKey);
        /* Element can still be in Static backtrace map
         * Indeed: 2 ASLR sensitive backtraces may correspond to
         * the same dladdr based backtrace(the missing index bug!).
         * */
        if(statHashKeyIte != __backtraceStaticMap.end()) {
            dfc = __backtraceStaticMap[staticHashKey];
            assert(dfc);
            __backtraceDynamicMap[dynHashKey] = dfc;
        }else{
            dfc = make_shared<DynFuncCall>(btVec, dynHashKey);
            __backtraceDynamicMap[dynHashKey] = dfc;
            dfc->updateBtSymbols(shk);
            assert(__backtraceStaticMap.end() == __backtraceStaticMap.find(staticHashKey));
            __backtraceStaticMap[staticHashKey] = dfc;
            __totalCallStacks += 1;
            DEBUG("total",cerr << __FUNCTION__ << ":" << __LINE__<< " Total Call Stack " << __totalCallStacks <<endl;);
        }
    }else{
        // The element is in Dynamic Hash Map
        DEBUG("total",cerr << __FUNCTION__ << ":" << __LINE__<< " Elt already in Dynamic Hash Map " << __totalCallStacks <<endl;);
        dfc = __backtraceDynamicMap[dynHashKey];
    }
    dfc->applyProfiling(sv);
    __totalDynCount++;
}